

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9CFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  int *piVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Ssc_Pars_t Pars;
  
  Ssc_ManSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_0024f6b9:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCacvh");
    iVar3 = globalUtilOptind;
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0024f770:
        Abc_Print(-1,pcVar4);
        goto LAB_0024f77a;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nBTLimit = iVar1;
    }
    else {
      if (iVar1 != 0x57) {
        piVar2 = &Pars.fAppend;
        if ((iVar1 != 0x61) && (piVar2 = &Pars.fVerify, iVar1 != 99)) {
          if (iVar1 != 0x76) {
            if (iVar1 == -1) {
              if (pAbc->pGia != (Gia_Man_t *)0x0) {
                pNew = Ssc_PerformSweepingConstr(pAbc->pGia,&Pars);
                Abc_FrameUpdateGia(pAbc,pNew);
                return 0;
              }
              pcVar4 = "Abc_CommandAbc9CFraig(): There is no AIG.\n";
              iVar3 = -1;
              goto LAB_0024f850;
            }
            goto LAB_0024f77a;
          }
          piVar2 = &Pars.fVerbose;
        }
        *(byte *)piVar2 = (byte)*piVar2 ^ 1;
        goto LAB_0024f6b9;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0024f770;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
    }
    globalUtilOptind = iVar3 + 1;
    if (iVar1 < 0) {
LAB_0024f77a:
      iVar3 = -2;
      Abc_Print(-2,"usage: &cfraig [-WC <num>] [-acvh]\n");
      Abc_Print(-2,"\t         performs combinational SAT sweeping under constraints\n");
      Abc_Print(-2,"\t         which are present in the AIG or set manually using \"constr\"\n");
      Abc_Print(-2,"\t         (constraints are listed as last POs and true when they are 0)\n");
      Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nBTLimit);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (Pars.fAppend == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle appending constraints to the result [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fVerify == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle performing internal verification [default = %s]\n",pcVar4);
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0024f850:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9CFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    Ssc_Pars_t Pars, * pPars = &Pars;
    Ssc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCacvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAppend ^= 1;
            break;
        case 'c':
            pPars->fVerify ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9CFraig(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Ssc_PerformSweepingConstr( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cfraig [-WC <num>] [-acvh]\n" );
    Abc_Print( -2, "\t         performs combinational SAT sweeping under constraints\n" );
    Abc_Print( -2, "\t         which are present in the AIG or set manually using \"constr\"\n" );
    Abc_Print( -2, "\t         (constraints are listed as last POs and true when they are 0)\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-a     : toggle appending constraints to the result [default = %s]\n", pPars->fAppend? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle performing internal verification [default = %s]\n", pPars->fVerify? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}